

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCluster;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  longlong lVar4;
  BlockEntry *pBVar5;
  long lVar6;
  Cluster **ppCVar7;
  ulong uVar8;
  Cluster **ppCVar9;
  
  lVar3 = GetFirst(this,pResult);
  if (-1 < lVar3) {
    iVar2 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar2 != 0) {
      pCluster = (*pResult)->m_pCluster;
      iVar2 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar4 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar2),pCluster);
      lVar3 = pCluster->m_pSegment->m_pInfo->m_timecodeScale;
      if ((lVar4 == 0) ||
         (lVar6 = -1,
         lVar3 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar4),0))) {
        lVar6 = lVar3 * lVar4;
      }
      if (lVar6 < time_ns) {
        lVar3 = this->m_pSegment->m_clusterCount;
        if (pCluster->m_index < lVar3) {
          ppCVar9 = this->m_pSegment->m_clusters;
          ppCVar1 = ppCVar9 + pCluster->m_index;
          ppCVar9 = ppCVar9 + lVar3;
          ppCVar7 = ppCVar1;
          do {
            uVar8 = ((long)ppCVar9 - (long)ppCVar7 >> 3) - ((long)ppCVar9 - (long)ppCVar7 >> 0x3f) &
                    0xfffffffffffffffe;
            lVar4 = Cluster::GetTime(*(Cluster **)((long)ppCVar7 + uVar8 * 4));
            if (time_ns < lVar4) {
              ppCVar9 = (Cluster **)(uVar8 * 4 + (long)ppCVar7);
            }
            else {
              ppCVar7 = (Cluster **)((long)ppCVar7 + uVar8 * 4 + 8);
            }
          } while (ppCVar7 < ppCVar9);
          for (; ppCVar1 < ppCVar7; ppCVar7 = ppCVar7 + -1) {
            pBVar5 = Cluster::GetEntry(ppCVar7[-1],this,-1);
            *pResult = pBVar5;
            if ((pBVar5 != (BlockEntry *)0x0) &&
               (iVar2 = (*pBVar5->_vptr_BlockEntry[3])(pBVar5), iVar2 != 0)) {
              return 0;
            }
          }
        }
        *pResult = &(this->m_eos).super_BlockEntry;
      }
    }
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}